

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O0

iter_type __thiscall
booster::locale::util::base_num_format<char>::do_real_put<long_long>
          (base_num_format<char> *this,iter_type out,ios_base *ios,char_type fill,longlong val)

{
  long lVar1;
  iter_type out_00;
  iter_type out_01;
  iter_type out_02;
  fmtflags __fmtfl;
  ios_base *ios_00;
  streamsize sVar2;
  streambuf_type *psVar3;
  uint64_t uVar4;
  ios_base *in_RCX;
  undefined1 in_DL;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 uVar5;
  time_t in_RSI;
  long *in_RDI;
  char in_R8B;
  long in_R9;
  iter_type iVar6;
  iter_type iVar7;
  iter_type in_stack_00000000;
  string_type *in_stack_00000030;
  bool intl;
  bool nat;
  sstream_type ss;
  ios_info *info;
  iter_type ret_ptr;
  ios_info *in_stack_fffffffffffffc88;
  bool local_369;
  time_t in_stack_fffffffffffffcf8;
  char_type fill_00;
  base_num_format<char> *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd21;
  char in_stack_fffffffffffffd40;
  string local_288 [40];
  undefined8 uStack_260;
  undefined8 uStack_240;
  undefined8 uStack_220;
  undefined8 uStack_200;
  streambuf_type *local_1f8;
  undefined1 local_1f0;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  locale local_1c8;
  long local_1c0 [47];
  ios_info *local_48;
  long local_40;
  char local_31;
  ios_base *local_30;
  undefined4 uStack_18;
  undefined4 in_stack_ffffffffffffffec;
  ios_base *in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff8;
  undefined7 in_stack_fffffffffffffff9;
  
  uStack_18 = CONCAT31(uStack_18._1_3_,in_DL);
  local_40 = in_R9;
  local_31 = in_R8B;
  local_30 = in_RCX;
  local_48 = ios_info::get((ios_base *)0x28b705);
  ios_00 = (ios_base *)ios_info::display_flags(local_48);
  fill_00 = (char_type)((ulong)in_RDI >> 0x38);
  switch(ios_00) {
  case (ios_base *)0x0:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::locale::classic();
    std::ios::imbue(&local_1c8);
    std::locale::~locale(&local_1c8);
    lVar1 = *(long *)(local_1c0[0] + -0x18);
    __fmtfl = std::ios_base::flags(local_30);
    std::ios_base::flags((ios_base *)((long)local_1c0 + lVar1),__fmtfl);
    lVar1 = *(long *)(local_1c0[0] + -0x18);
    sVar2 = std::ios_base::precision(local_30);
    std::ios_base::precision((ios_base *)((long)local_1c0 + lVar1),sVar2);
    lVar1 = *(long *)(local_1c0[0] + -0x18);
    sVar2 = std::ios_base::width(local_30);
    std::ios_base::width((ios_base *)((long)local_1c0 + lVar1),sVar2);
    local_1e8 = (undefined4)in_RSI;
    uStack_1e4 = (undefined4)((ulong)in_RSI >> 0x20);
    uStack_1e0 = uStack_18;
    local_1f8 = (streambuf_type *)
                std::num_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::do_put
                          (in_RDI,in_RSI,uStack_18,(long)local_1c0 + *(long *)(local_1c0[0] + -0x18)
                           ,(int)local_31,local_40);
    local_1f0 = extraout_DL;
    psVar3 = local_1f8;
    uVar5 = extraout_DL;
    std::ios_base::width(local_30,0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    iVar6._8_8_ = extraout_RDX;
    iVar6._M_sbuf = psVar3;
    break;
  case (ios_base *)0x1:
  case (ios_base *)0x3:
  case (ios_base *)0x8:
  case (ios_base *)0x9:
  default:
    iVar6 = (iter_type)
            std::num_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::do_put
                      (in_RDI,in_RSI,uStack_18,local_30,(int)local_31,local_40);
    uVar5 = iVar6._M_failed;
    break;
  case (ios_base *)0x2:
    uVar4 = ios_info::currency_flags(local_48);
    local_369 = true;
    if (uVar4 != 0) {
      uVar4 = ios_info::currency_flags(local_48);
      local_369 = uVar4 == 0x40;
    }
    iVar6 = (iter_type)
            (**(code **)(*in_RDI + 0x50))
                      (in_RDI,~local_369 & 1,in_RSI,uStack_18,local_30,(int)local_31,
                       (longdouble)local_40);
    uVar5 = iVar6._M_failed;
    break;
  case (ios_base *)0x4:
    uStack_200 = CONCAT44(in_stack_ffffffffffffffec,uStack_18);
    out_00._M_failed = (bool)in_stack_fffffffffffffd20;
    out_00._M_sbuf = (streambuf_type *)in_stack_fffffffffffffd18;
    out_00._9_7_ = in_stack_fffffffffffffd21;
    iVar6 = format_time(in_stack_fffffffffffffd10,out_00,ios_00,fill_00,in_stack_fffffffffffffcf8,
                        in_stack_fffffffffffffd40);
    uVar5 = iVar6._M_failed;
    break;
  case (ios_base *)0x5:
    uStack_220 = CONCAT44(in_stack_ffffffffffffffec,uStack_18);
    out_01._M_failed = (bool)in_stack_fffffffffffffd20;
    out_01._M_sbuf = (streambuf_type *)in_stack_fffffffffffffd18;
    out_01._9_7_ = in_stack_fffffffffffffd21;
    iVar6 = format_time(in_stack_fffffffffffffd10,out_01,ios_00,fill_00,in_stack_fffffffffffffcf8,
                        in_stack_fffffffffffffd40);
    uVar5 = iVar6._M_failed;
    break;
  case (ios_base *)0x6:
    uStack_240 = CONCAT44(in_stack_ffffffffffffffec,uStack_18);
    out_02._M_failed = (bool)in_stack_fffffffffffffd20;
    out_02._M_sbuf = (streambuf_type *)in_stack_fffffffffffffd18;
    out_02._9_7_ = in_stack_fffffffffffffd21;
    iVar6 = format_time(in_stack_fffffffffffffd10,out_02,ios_00,fill_00,in_stack_fffffffffffffcf8,
                        in_stack_fffffffffffffd40);
    uVar5 = iVar6._M_failed;
    break;
  case (ios_base *)0x7:
    uStack_260 = CONCAT44(in_stack_ffffffffffffffec,uStack_18);
    ios_info::date_time_pattern<char>(in_stack_fffffffffffffc88);
    iVar6 = format_time((base_num_format<char> *)
                        CONCAT71(in_stack_fffffffffffffff9,in_stack_fffffffffffffff8),
                        in_stack_00000000,in_stack_fffffffffffffff0,
                        (char_type)((uint)in_stack_ffffffffffffffec >> 0x18),in_RSI,
                        in_stack_00000030);
    psVar3 = iVar6._M_sbuf;
    uVar5 = iVar6._M_failed;
    std::__cxx11::string::~string(local_288);
    iVar6._8_8_ = extraout_RDX_00;
    iVar6._M_sbuf = psVar3;
  }
  iVar7._9_7_ = iVar6._9_7_;
  iVar7._M_failed = (bool)uVar5;
  iVar7._M_sbuf = iVar6._M_sbuf;
  return iVar7;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        typedef std::num_put<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                typedef std::basic_ostringstream<char_type> sstream_type;
                sstream_type ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                ss.width(ios.width());
                iter_type ret_ptr = super::do_put(out,ss,fill,val);
                ios.width(0);
                return ret_ptr;
            }
        case flags::date:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'x');
        case flags::time:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'X');
        case flags::datetime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'c');
        case flags::strftime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),info.date_time_pattern<char_type>());
        case flags::currency:
            {
                bool nat =  info.currency_flags()==flags::currency_default 
                            || info.currency_flags() == flags::currency_national;
                bool intl = !nat;
                return do_format_currency(intl,out,ios,fill,static_cast<long double>(val));
            }

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_put(out,ios,fill,val);
        }
    }